

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void Rescale(CPpmd8 *p)

{
  byte bVar1;
  UInt16 UVar2;
  ushort uVar3;
  undefined4 uVar4;
  CPpmd_State_Ref CVar5;
  CPpmd_State *pCVar6;
  undefined1 uVar7;
  Byte BVar8;
  Byte BVar9;
  UInt16 UVar10;
  UInt16 UVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  Byte *pBVar15;
  byte bVar16;
  uint uVar17;
  Byte *pBVar18;
  CPpmd8_Context *pCVar19;
  uint uVar20;
  CPpmd_State *node;
  byte bVar21;
  uint uVar22;
  byte *pbVar23;
  CPpmd_State *pCVar24;
  CPpmd_State *pCVar25;
  uint uVar26;
  bool bVar27;
  CPpmd_State tmp;
  
  pCVar6 = p->FoundState;
  node = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar2 = pCVar6->SuccessorHigh;
  BVar8 = pCVar6->Symbol;
  BVar9 = pCVar6->Freq;
  UVar10 = pCVar6->SuccessorLow;
  for (pBVar18 = &pCVar6->Freq; pCVar6 = (CPpmd_State *)(pBVar18 + -1), pCVar6 != node;
      pBVar18 = pBVar18 + -6) {
    *(UInt16 *)(pBVar18 + 3) = *(UInt16 *)(pBVar18 + -3);
    uVar4 = *(undefined4 *)(pBVar18 + -7);
    pCVar6->Symbol = (char)uVar4;
    pCVar6->Freq = (char)((uint)uVar4 >> 8);
    pCVar6->SuccessorLow = (short)((uint)uVar4 >> 0x10);
  }
  *(UInt16 *)(pBVar18 + 3) = UVar2;
  pCVar24 = (CPpmd_State *)(pBVar18 + -1);
  pCVar24->Symbol = BVar8;
  pCVar24->Freq = BVar9;
  pCVar24->SuccessorLow = UVar10;
  pCVar19 = p->MinContext;
  uVar3 = pCVar19->SummFreq;
  bVar21 = *pBVar18;
  bVar27 = p->OrderFall != 0;
  uVar20 = (bVar21 + 4 & 0xff) + (uint)bVar27 >> 1;
  *pBVar18 = (byte)uVar20;
  uVar22 = (uint)pCVar19->NumStats;
  uVar26 = (uint)uVar3 - (uint)bVar21;
  do {
    uVar12 = uVar26;
    pCVar24 = pCVar6;
    pBVar15 = pBVar18;
    bVar21 = pCVar24[1].Freq;
    uVar17 = (uint)bVar21 + (uint)bVar27 >> 1;
    bVar16 = (byte)uVar17;
    pCVar24[1].Freq = bVar16;
    if (pCVar24->Freq < uVar17) {
      bVar1 = pCVar24[1].Symbol;
      UVar2 = pCVar24[1].SuccessorLow;
      UVar10 = pCVar24[1].SuccessorHigh;
      pCVar6 = pCVar24;
      do {
        pCVar25 = pCVar6;
        pCVar25[1].SuccessorHigh = pCVar25->SuccessorHigh;
        BVar8 = pCVar25->Freq;
        UVar11 = pCVar25->SuccessorLow;
        pCVar25[1].Symbol = pCVar25->Symbol;
        pCVar25[1].Freq = BVar8;
        pCVar25[1].SuccessorLow = UVar11;
        if (pCVar25 == node) break;
        pCVar6 = pCVar25 + -1;
      } while (pCVar25[-1].Freq < bVar16);
      pCVar25->Symbol = bVar1;
      pCVar25->Freq = bVar16;
      pCVar25->SuccessorLow = UVar2;
      pCVar25->SuccessorHigh = UVar10;
    }
    uVar26 = uVar12 - bVar21;
    uVar20 = uVar20 + uVar17;
    uVar22 = uVar22 - 1;
    pBVar18 = pBVar15 + 6;
    pCVar6 = pCVar24 + 1;
    if (uVar22 == 0) {
      pCVar19 = p->MinContext;
      if (pCVar24[1].Freq == '\0') {
        bVar16 = pCVar19->NumStats;
        uVar12 = bVar21 - uVar12;
        bVar21 = bVar16;
        do {
          uVar12 = uVar12 - 1;
          bVar21 = bVar21 - 1;
          bVar1 = *pBVar15;
          pBVar15 = pBVar15 + -6;
        } while (bVar1 == 0);
        uVar26 = -uVar12;
        pCVar19->NumStats = bVar21;
        if (bVar21 == 0) {
          bVar21 = node->Symbol;
          CVar5 = *(CPpmd_State_Ref *)&node->SuccessorLow;
          uVar13 = (ulong)(~uVar12 + (uint)node->Freq * 2) / (ulong)uVar26;
          uVar7 = 0x29;
          if (((uint)uVar13 & 0xfe) < 0x2a) {
            uVar7 = (char)uVar13;
          }
          InsertNode(p,node,(uint)p->Units2Indx[(bVar16 + 2 >> 1) - 1]);
          pCVar19 = p->MinContext;
          pCVar19->Flags = (0x3f < bVar21) << 3 | pCVar19->Flags & 0x10;
          p->FoundState = (CPpmd_State *)&pCVar19->SummFreq;
          *(byte *)&pCVar19->SummFreq = bVar21;
          *(undefined1 *)((long)&pCVar19->SummFreq + 1) = uVar7;
          pCVar19->Stats = CVar5;
          return;
        }
        uVar12 = bVar16 + 2 >> 1;
        uVar22 = bVar21 + 2 >> 1;
        if (uVar12 == uVar22) {
          pBVar18 = p->Base;
          uVar22 = pCVar19->Stats;
        }
        else {
          pvVar14 = ShrinkUnits(p,node,uVar12,uVar22);
          pCVar19 = p->MinContext;
          pBVar18 = p->Base;
          uVar22 = (int)pvVar14 - (int)pBVar18;
          pCVar19->Stats = uVar22;
          bVar21 = pCVar19->NumStats;
        }
        uVar12 = (uint)bVar21;
        uVar13 = (ulong)uVar22;
        pbVar23 = pBVar18 + uVar13;
        bVar21 = (0x3f < *pbVar23) << 3 | pCVar19->Flags & 0xf7;
        do {
          pbVar23 = pbVar23 + 6;
          bVar21 = bVar21 | (0x3f < *pbVar23) << 3;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        pCVar19->Flags = bVar21;
      }
      else {
        bVar21 = pCVar19->Flags;
        pBVar18 = p->Base;
        uVar13 = (ulong)pCVar19->Stats;
      }
      pCVar19->SummFreq = ((short)uVar20 + (short)uVar26) - (short)(uVar26 >> 1);
      pCVar19->Flags = bVar21 | 4;
      p->FoundState = (CPpmd_State *)(pBVar18 + uVar13);
      return;
    }
  } while( true );
}

Assistant:

static void Rescale(CPpmd8 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0
      #ifdef PPMD8_FREEZE_SUPPORT
      || p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE
      #endif
      );
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (Byte)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 0)
    {
      CPpmd_State tmp = *stats;
      tmp.Freq = (Byte)((2 * tmp.Freq + escFreq - 1) / escFreq);
      if (tmp.Freq > MAX_FREQ / 3)
        tmp.Freq = MAX_FREQ / 3;
      InsertNode(p, stats, U2I((numStats + 2) >> 1));
      p->MinContext->Flags = (Byte)((p->MinContext->Flags & 0x10) + 0x08 * (tmp.Symbol >= 0x40));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 2) >> 1;
    n1 = (p->MinContext->NumStats + 2) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
    p->MinContext->Flags &= ~0x08;
    p->MinContext->Flags |= 0x08 * ((s = STATS(p->MinContext))->Symbol >= 0x40);
    i = p->MinContext->NumStats;
    do { p->MinContext->Flags |= 0x08*((++s)->Symbol >= 0x40); } while (--i);
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->MinContext->Flags |= 0x4;
  p->FoundState = STATS(p->MinContext);
}